

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json.c++
# Opt level: O1

void __thiscall capnp::JsonCodec::JsonCodec(JsonCodec *this)

{
  Impl *__s;
  
  __s = (Impl *)operator_new(0x138);
  memset(__s,0,0x138);
  __s->maxNestingDepth = 0x40;
  __s->rejectUnknownFields = false;
  (__s->typeHandlers).table.rows.builder.ptr = (Entry *)0x0;
  (__s->typeHandlers).table.rows.builder.pos =
       (RemoveConst<kj::HashMap<capnp::Type,_capnp::JsonCodec::HandlerBase_*>::Entry> *)0x0;
  (__s->typeHandlers).table.rows.builder.endPtr = (Entry *)0x0;
  (__s->typeHandlers).table.rows.builder.disposer =
       (ArrayDisposer *)&kj::NullArrayDisposer::instance;
  (__s->typeHandlers).table.indexes.erasedCount = 0;
  (__s->typeHandlers).table.indexes.buckets.ptr = (HashBucket *)0x0;
  (__s->typeHandlers).table.indexes.buckets.size_ = 0;
  (__s->typeHandlers).table.indexes.buckets.disposer = (ArrayDisposer *)0x0;
  (__s->fieldHandlers).table.rows.builder.ptr = (Entry *)0x0;
  (__s->fieldHandlers).table.rows.builder.pos =
       (RemoveConst<kj::HashMap<capnp::StructSchema::Field,_capnp::JsonCodec::HandlerBase_*>::Entry>
        *)0x0;
  (__s->fieldHandlers).table.rows.builder.endPtr = (Entry *)0x0;
  (__s->fieldHandlers).table.rows.builder.disposer =
       (ArrayDisposer *)&kj::NullArrayDisposer::instance;
  (__s->fieldHandlers).table.indexes.erasedCount = 0;
  (__s->fieldHandlers).table.indexes.buckets.ptr = (HashBucket *)0x0;
  (__s->fieldHandlers).table.indexes.buckets.size_ = 0;
  (__s->fieldHandlers).table.indexes.buckets.disposer = (ArrayDisposer *)0x0;
  (__s->annotatedHandlers).table.rows.builder.ptr = (Entry *)0x0;
  (__s->annotatedHandlers).table.rows.builder.pos =
       (RemoveConst<kj::HashMap<capnp::Type,_kj::Maybe<kj::Own<capnp::JsonCodec::AnnotatedHandler>_>_>::Entry>
        *)0x0;
  (__s->annotatedHandlers).table.rows.builder.endPtr = (Entry *)0x0;
  (__s->annotatedHandlers).table.rows.builder.disposer =
       (ArrayDisposer *)&kj::NullArrayDisposer::instance;
  (__s->annotatedHandlers).table.indexes.erasedCount = 0;
  (__s->annotatedHandlers).table.indexes.buckets.ptr = (HashBucket *)0x0;
  (__s->annotatedHandlers).table.indexes.buckets.size_ = 0;
  (__s->annotatedHandlers).table.indexes.buckets.disposer = (ArrayDisposer *)0x0;
  (__s->annotatedEnumHandlers).table.rows.builder.ptr = (Entry *)0x0;
  (__s->annotatedEnumHandlers).table.rows.builder.pos =
       (RemoveConst<kj::HashMap<capnp::Type,_kj::Own<capnp::JsonCodec::AnnotatedEnumHandler>_>::Entry>
        *)0x0;
  (__s->annotatedEnumHandlers).table.rows.builder.endPtr = (Entry *)0x0;
  (__s->annotatedEnumHandlers).table.rows.builder.disposer =
       (ArrayDisposer *)&kj::NullArrayDisposer::instance;
  (__s->annotatedEnumHandlers).table.indexes.buckets.size_ = 0;
  (__s->annotatedEnumHandlers).table.indexes.buckets.disposer = (ArrayDisposer *)0x0;
  (__s->annotatedEnumHandlers).table.indexes.erasedCount = 0;
  (__s->annotatedEnumHandlers).table.indexes.buckets.ptr = (HashBucket *)0x0;
  (this->impl).disposer = (Disposer *)&kj::_::HeapDisposer<capnp::JsonCodec::Impl>::instance;
  (this->impl).ptr = __s;
  return;
}

Assistant:

JsonCodec::JsonCodec()
    : impl(kj::heap<Impl>()) {}